

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsSetModuleHostInfo(JsModuleRecord requestModule,JsModuleHostInfoKind moduleHostInfo,void *hostInfo)

{
  anon_class_24_3_8dd2aba2 fn;
  bool bVar1;
  JsErrorCode JVar2;
  JsrtContext *pJVar3;
  JavascriptLibrary *this;
  JsErrorCode errorCode;
  JsrtContext *jsrtContext;
  SourceTextModuleRecord *moduleRecord;
  ScriptContext *scriptContext;
  void *hostInfo_local;
  JsModuleRecord pvStack_18;
  JsModuleHostInfoKind moduleHostInfo_local;
  JsModuleRecord requestModule_local;
  
  scriptContext = (ScriptContext *)hostInfo;
  hostInfo_local._4_4_ = moduleHostInfo;
  pvStack_18 = requestModule;
  bVar1 = Js::SourceTextModuleRecord::Is(requestModule);
  if (bVar1) {
    jsrtContext = (JsrtContext *)Js::SourceTextModuleRecord::FromHost(pvStack_18);
    moduleRecord = (SourceTextModuleRecord *)
                   Js::SourceTextModuleRecord::GetScriptContext
                             ((SourceTextModuleRecord *)jsrtContext);
  }
  else {
    if (((hostInfo_local._4_4_ == JsModuleHostInfo_Exception) ||
        (hostInfo_local._4_4_ == JsModuleHostInfo_HostDefined)) ||
       (hostInfo_local._4_4_ == JsModuleHostInfo_Url)) {
      return JsErrorInvalidArgument;
    }
    pJVar3 = JsrtContext::GetCurrent();
    moduleRecord = (SourceTextModuleRecord *)JsrtContext::GetScriptContext(pJVar3);
  }
  this = Js::ScriptContext::GetLibrary((ScriptContext *)moduleRecord);
  pJVar3 = (JsrtContext *)Js::JavascriptLibrary::GetJsrtContext(this);
  fn.moduleRecord = (SourceTextModuleRecord **)&jsrtContext;
  fn.moduleHostInfo = (JsModuleHostInfoKind *)((long)&hostInfo_local + 4);
  fn.hostInfo = &scriptContext;
  JVar2 = SetContextAPIWrapper<JsSetModuleHostInfo::__0>(pJVar3,fn);
  return JVar2;
}

Assistant:

CHAKRA_API
JsSetModuleHostInfo(
    _In_opt_ JsModuleRecord requestModule,
    _In_ JsModuleHostInfoKind moduleHostInfo,
    _In_ void* hostInfo)
{
    Js::ScriptContext* scriptContext;
    Js::SourceTextModuleRecord* moduleRecord;
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        if (moduleHostInfo == JsModuleHostInfo_Exception ||
            moduleHostInfo == JsModuleHostInfo_HostDefined ||
            moduleHostInfo == JsModuleHostInfo_Url)
        {
            return JsErrorInvalidArgument;
        }
        scriptContext = JsrtContext::GetCurrent()->GetScriptContext();
    }
    else
    {
        moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
        scriptContext = moduleRecord->GetScriptContext();
    }
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        JsrtContextCore* currentContext = static_cast<JsrtContextCore*>(JsrtContextCore::GetCurrent());
        switch (moduleHostInfo)
        {
        case JsModuleHostInfo_Exception:
            {
            HRESULT hr = moduleRecord->OnHostException(hostInfo);
            return (hr == NOERROR) ? JsNoError : JsErrorInvalidArgument;
            }
        case JsModuleHostInfo_HostDefined:
            moduleRecord->SetHostDefined(hostInfo);
            break;
        case JsModuleHostInfo_FetchImportedModuleCallback:
            currentContext->GetHostScriptContext()->SetFetchImportedModuleCallback(reinterpret_cast<FetchImportedModuleCallBack>(hostInfo));
            break;
        case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
            currentContext->GetHostScriptContext()->SetFetchImportedModuleFromScriptCallback(reinterpret_cast<FetchImportedModuleFromScriptCallBack>(hostInfo));
            break;
        case JsModuleHostInfo_NotifyModuleReadyCallback:
            currentContext->GetHostScriptContext()->SetNotifyModuleReadyCallback(reinterpret_cast<NotifyModuleReadyCallback>(hostInfo));
            break;
        case JsModuleHostInfo_InitializeImportMetaCallback:
            currentContext->GetHostScriptContext()->SetInitializeImportMetaCallback(reinterpret_cast<InitializeImportMetaCallback>(hostInfo));
            break;
        case JsModuleHostInfo_ReportModuleCompletionCallback:
            currentContext->GetHostScriptContext()->SetReportModuleCompletionCallback(reinterpret_cast<ReportModuleCompletionCallback>(hostInfo));
            break;
        case JsModuleHostInfo_Url:
            moduleRecord->SetSpecifier(hostInfo);
            break;
        default:
            return JsInvalidModuleHostInfoKind;
        };
        return JsNoError;
    });
    return errorCode;
}